

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_inc_helper_unpolar<ExchCXX::BuiltinPKZB_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps)

{
  double __x;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0 < N) {
    uVar1 = 0;
    do {
      __x = rho[uVar1];
      dVar6 = 0.0;
      if (1e-15 < __x) {
        dVar6 = 1.0000000000000052e-40;
        if (1.0000000000000052e-40 <= sigma[uVar1]) {
          dVar6 = sigma[uVar1];
        }
        dVar9 = 1e-20;
        if (1e-20 <= tau[uVar1]) {
          dVar9 = tau[uVar1];
        }
        dVar4 = __x * 8.0 * dVar9;
        if (dVar6 <= dVar4) {
          dVar4 = dVar6;
        }
        dVar6 = cbrt(1.0);
        dVar2 = cbrt(__x);
        dVar5 = __x * __x;
        dVar8 = 1.0 / (dVar2 * dVar2);
        dVar3 = (dVar8 / dVar5) * dVar4 * 1.5874010519681996;
        dVar7 = dVar3 * 0.3949273883044934;
        dVar9 = dVar7 / -288.0 +
                dVar9 * 1.5874010519681996 * 0.3949273883044934 * (dVar8 / __x) * 0.25 + -0.45;
        dVar6 = dVar6 * -0.36927938319101117 * dVar2 *
                (-0.646416 /
                 (dVar4 * dVar4 * 1.2599210498948732 * 7.146198415809576e-05 *
                  ((1.0 / dVar2) / (dVar5 * dVar5 * __x)) +
                 dVar9 * 1.8171205928321397 * 0.21733691746289932 * -0.007510288065843622 * dVar3 +
                 dVar9 * dVar9 * 0.07209876543209877 + dVar7 * 0.0051440329218107 + 0.804) + 1.804);
        dVar6 = (double)(~-(ulong)(__x * 0.5 <= 1e-15) & (ulong)(dVar6 + dVar6));
      }
      eps[uVar1] = dVar6 * scal_fact + eps[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

MGGA_EXC_INC_GENERATOR( host_eval_exc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double e;
    const double lapl_i = traits::needs_laplacian ? lapl[i] : 0.0;
    traits::eval_exc_unpolar( rho[i], sigma[i], lapl_i, tau[i], e );
    eps[i] += scal_fact * e;

  }

}